

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  _data *p_Var1;
  int extraout_EAX;
  legacy_async_pool *this_00;
  intrusive_ptr<cppcms::application> iStack_98;
  shared_ptr<cppcms::application_specific_pool> p;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_80;
  unique_lock<std::recursive_mutex> lock;
  attachment local_60;
  
  this_00 = (legacy_async_pool *)operator_new(0x28);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            (&iStack_98,(intrusive_ptr<cppcms::application> *)__special_file);
  impl::legacy_async_pool::legacy_async_pool(this_00,&iStack_98);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::legacy_async_pool,void>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&p,
             this_00);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&iStack_98);
  (((p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->d)
  .ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags
            (p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,0x8001);
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&((this->d).ptr_)->lock);
  p_Var1 = (this->d).ptr_;
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>);
  _data::attachment::attachment
            (&local_60,(shared_ptr<cppcms::application_specific_pool> *)&local_80,
             (mount_point *)__dir);
  std::__cxx11::
  list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ::push_back(&p_Var1->legacy_async_apps,&local_60);
  _data::attachment::~attachment(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_async_pool(app));
	p->size(d->thread_count);
	p->flags(app::legacy | app::asynchronous);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->legacy_async_apps.push_back(_data::attachment(p,mp));
}